

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

void __thiscall
Wasm::PolymorphicEmitInfo::Init(PolymorphicEmitInfo *this,uint32 count,ArenaAllocator *alloc)

{
  EmitInfo *pEVar1;
  
  (this->field_1).infos = (EmitInfo *)0x0;
  if (1 < count) {
    pEVar1 = Memory::AllocateArray<Memory::ArenaAllocator,Wasm::EmitInfo,false>
                       ((Memory *)alloc,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                        (ulong)count);
    (this->field_1).infos = pEVar1;
  }
  this->count = count;
  return;
}

Assistant:

void PolymorphicEmitInfo::Init(uint32 count, ArenaAllocator* alloc)
{
    infos = nullptr;
    if (count > 1)
    {
        infos = AnewArray(alloc, EmitInfo, count);
    }
    this->count = count;
}